

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall
cs::type_t::type_t(type_t *this,function<cs_impl::any_()> *c,type_id *i,namespace_t *ext)

{
  function<cs_impl::any_()> *in_RCX;
  undefined8 *in_RDX;
  long in_RDI;
  function<cs_impl::any_()> *in_stack_ffffffffffffffc8;
  
  std::function<cs_impl::any_()>::function(in_RCX,in_stack_ffffffffffffffc8);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_RCX,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x30) = *in_RDX;
  *(undefined8 *)(in_RDI + 0x38) = in_RDX[1];
  return;
}

Assistant:

type_t(std::function<var()> c, const type_id &i, namespace_t ext) : constructor(std::move(c)), id(i),
			extensions(std::move(ext)) {}